

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::converter::ProtoWriter::ProtoElement::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ProtoElement *this)

{
  _Map_pointer *src;
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_ptr<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  *puVar3;
  undefined4 extraout_var_01;
  Field *pFVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  AlphaNum local_158;
  undefined1 local_128 [8];
  stack<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>_>
  element_stack;
  string name;
  pointer pcStack_b0;
  AlphaNum local_98;
  AlphaNum local_68;
  ProtoElement *local_38;
  ProtoElement *now;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_128);
  local_38 = this;
  std::
  stack<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*,std::deque<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*,std::allocator<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*>>>
  ::
  stack<std::deque<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*,std::allocator<google::protobuf::util::converter::ProtoWriter::ProtoElement_const*>>,void>
            ((stack<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>_>
              *)local_128);
  while (iVar2 = (*(this->super_BaseElement)._vptr_BaseElement[2])(this),
        CONCAT44(extraout_var,iVar2) != 0) {
    std::
    deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
    ::push_back((deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                 *)local_128,&local_38);
    iVar2 = (*(local_38->super_BaseElement)._vptr_BaseElement[2])();
    this = (ProtoElement *)CONCAT44(extraout_var_00,iVar2);
    local_38 = this;
  }
  src = &element_stack.c.
         super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
  do {
    if (element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
        (_Map_pointer)
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_map_size) {
      std::
      _Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
      ::~_Deque_base((_Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                      *)local_128);
      return __return_storage_ptr__;
    }
    puVar3 = (unique_ptr<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
              *)element_stack.c.
                super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    if ((_Elt_pointer)
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node ==
        element_stack.c.
        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      puVar3 = &element_stack.c.
                super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last[-1][3].super_BaseElement.parent_;
    }
    local_38 = (ProtoElement *)((BaseElement *)(puVar3 + -1))->_vptr_BaseElement;
    std::
    deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
    ::pop_back((deque<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                *)local_128);
    pFVar4 = local_38->parent_field_;
    if (pFVar4->cardinality_ == 3) {
      iVar2 = (*(local_38->super_BaseElement)._vptr_BaseElement[2])();
      pFVar4 = local_38->parent_field_;
      if (*(Field **)(CONCAT44(extraout_var_01,iVar2) + 0x28) != pFVar4) goto LAB_0033088c;
    }
    else {
LAB_0033088c:
      std::__cxx11::string::string((string *)src,(string *)(pFVar4->name_).ptr_);
      pcVar5 = (pointer)0x0;
      while ((_Var6 = name._M_dataplus, name._M_dataplus._M_p != pcVar5 &&
             (((bVar1 = *(byte *)((long)element_stack.c.
                                        super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_node +
                                 (long)pcVar5), bVar1 == 0x5f || ((byte)(bVar1 - 0x30) < 10)) ||
              (_Var6._M_p = pcVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))))) {
        pcVar5 = pcVar5 + 1;
      }
      if (name._M_dataplus._M_p == _Var6._M_p && (int)_Var6._M_p != 0) {
        if (__return_storage_ptr__->_M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
        else {
          local_68.piece_data_ = ".";
          local_68.piece_size_ = 1;
          local_158.piece_data_ =
               (char *)element_stack.c.
                       super__Deque_base<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::allocator<const_google::protobuf::util::converter::ProtoWriter::ProtoElement_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node;
          local_158.piece_size_ = (size_t)name._M_dataplus._M_p;
          StrAppend(__return_storage_ptr__,&local_68,&local_158);
        }
      }
      else {
        local_68.piece_data_ = "[\"";
        local_68.piece_size_ = 2;
        CEscape((string *)((long)&name.field_2 + 8),(string *)src);
        local_158.piece_data_ = (char *)name.field_2._8_8_;
        local_158.piece_size_ = (size_t)pcStack_b0;
        local_98.piece_data_ = "\"]";
        local_98.piece_size_ = 2;
        StrAppend(__return_storage_ptr__,&local_68,&local_158,&local_98);
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)src);
      pFVar4 = local_38->parent_field_;
    }
    if ((pFVar4->cardinality_ == 3) && (0 < local_38->array_index_)) {
      local_68.piece_data_ = "[";
      local_68.piece_size_ = 1;
      strings::AlphaNum::AlphaNum(&local_158,local_38->array_index_ + -1);
      local_98.piece_data_ = "]";
      local_98.piece_size_ = 1;
      StrAppend(__return_storage_ptr__,&local_68,&local_158,&local_98);
    }
  } while( true );
}

Assistant:

std::string ProtoWriter::ProtoElement::ToString() const {
  std::string loc = "";

  // first populate a stack with the nodes since we need to process them
  // from root to leaf when generating the string location
  const ProtoWriter::ProtoElement* now = this;
  std::stack<const ProtoWriter::ProtoElement*> element_stack;
  while (now->parent() != nullptr) {
    element_stack.push(now);
    now = now->parent();
  }

  // now pop each node from the stack and append to the location string
  while (!element_stack.empty()) {
    now = element_stack.top();
    element_stack.pop();

    if (!ow_->IsRepeated(*(now->parent_field_)) ||
        now->parent()->parent_field_ != now->parent_field_) {
      std::string name = now->parent_field_->name();
      int i = 0;
      while (i < name.size() && (ascii_isalnum(name[i]) || name[i] == '_')) ++i;
      if (i > 0 && i == name.size()) {  // safe field name
        if (loc.empty()) {
          loc = name;
        } else {
          StrAppend(&loc, ".", name);
        }
      } else {
        StrAppend(&loc, "[\"", CEscape(name), "\"]");
      }
    }

    int array_index_now = now->array_index_;
    if (ow_->IsRepeated(*(now->parent_field_)) && array_index_now > 0) {
      StrAppend(&loc, "[", array_index_now - 1, "]");
    }
  }

  return loc;
}